

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

_Bool BinarySource_data_avail(BinarySource *src,size_t wanted)

{
  if (src->err == BSE_NO_ERROR) {
    if (wanted <= src->len - src->pos) {
      return true;
    }
    src->err = BSE_OUT_OF_DATA;
  }
  return false;
}

Assistant:

static bool BinarySource_data_avail(BinarySource *src, size_t wanted)
{
    if (src->err)
        return false;

    if (wanted <= src->len - src->pos)
        return true;

    src->err = BSE_OUT_OF_DATA;
    return false;
}